

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Message
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  Descriptor *pDVar1;
  FieldDescriptor *pFVar2;
  bool bVar3;
  int iVar4;
  DescriptorProto *proto_00;
  FieldDescriptorProto *pFVar5;
  DescriptorProto_ExtensionRange *descriptor;
  MessageOptions *this_00;
  string_view sVar6;
  int local_2c;
  int local_28;
  int i_2;
  int i_1;
  int i;
  DescriptorProto *proto_local;
  Descriptor *message_local;
  DescriptorBuilder *this_local;
  
  for (i_2 = 0; iVar4 = Descriptor::nested_type_count(message), i_2 < iVar4; i_2 = i_2 + 1) {
    pDVar1 = message->nested_types_;
    proto_00 = DescriptorProto::nested_type(proto,i_2);
    ValidateProto3Message(this,pDVar1 + i_2,proto_00);
  }
  for (local_28 = 0; iVar4 = Descriptor::field_count(message), local_28 < iVar4;
      local_28 = local_28 + 1) {
    pFVar2 = message->fields_;
    pFVar5 = DescriptorProto::field(proto,local_28);
    ValidateProto3Field(this,pFVar2 + local_28,pFVar5);
  }
  for (local_2c = 0; iVar4 = Descriptor::extension_count(message), local_2c < iVar4;
      local_2c = local_2c + 1) {
    pFVar2 = message->extensions_;
    pFVar5 = DescriptorProto::extension(proto,local_2c);
    ValidateProto3Field(this,pFVar2 + local_2c,pFVar5);
  }
  iVar4 = Descriptor::extension_range_count(message);
  if (0 < iVar4) {
    sVar6 = Descriptor::full_name(message);
    descriptor = DescriptorProto::extension_range(proto,0);
    AddError(this,sVar6,&descriptor->super_Message,NUMBER,
             "Extension ranges are not allowed in proto3.");
  }
  this_00 = Descriptor::options(message);
  bVar3 = MessageOptions::message_set_wire_format(this_00);
  if (bVar3) {
    sVar6 = Descriptor::full_name(message);
    AddError(this,sVar6,&proto->super_Message,NAME,"MessageSet is not supported in proto3.");
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Message(const Descriptor* message,
                                              const DescriptorProto& proto) {
  for (int i = 0; i < message->nested_type_count(); ++i) {
    ValidateProto3Message(message->nested_types_ + i, proto.nested_type(i));
  }
  for (int i = 0; i < message->field_count(); ++i) {
    ValidateProto3Field(message->fields_ + i, proto.field(i));
  }
  for (int i = 0; i < message->extension_count(); ++i) {
    ValidateProto3Field(message->extensions_ + i, proto.extension(i));
  }
  if (message->extension_range_count() > 0) {
    AddError(message->full_name(), proto.extension_range(0),
             DescriptorPool::ErrorCollector::NUMBER,
             "Extension ranges are not allowed in proto3.");
  }
  if (message->options().message_set_wire_format()) {
    // Using MessageSet doesn't make sense since we disallow extensions.
    AddError(message->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
             "MessageSet is not supported in proto3.");
  }
}